

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O3

Id dxil_spv::build_descriptor_qa_check_function(SPIRVModule *module)

{
  Module **ppMVar1;
  Vector<Id> *pVVar2;
  Id id;
  uint value;
  pointer ppIVar3;
  uint64_t uVar4;
  Builder *this;
  _Head_base<0UL,_spv::Instruction_*,_false> _Var5;
  Instruction *instruction;
  Id IVar6;
  Id IVar7;
  Id IVar8;
  Builder *pBVar9;
  DescriptorQAInfo *pDVar10;
  Function *pFVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  Instruction *pIVar14;
  Block *pBVar15;
  Block *pBVar16;
  Instruction *pIVar17;
  uint *puVar18;
  Instruction *raw_instruction_3;
  Instruction *raw_instruction_2;
  iterator iVar19;
  Instruction *raw_instruction_6;
  Instruction *raw_instruction_1;
  Id IVar20;
  Instruction *raw_instruction_7;
  long lVar21;
  Instruction *raw_instruction;
  Id u32_type;
  Id uvec2_type;
  Block *entry_1;
  Vector<spv::Id> param_types;
  Block *entry;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_148;
  _Head_base<0UL,_spv::Instruction_*,_false> local_130;
  Id local_124;
  Builder *local_120;
  Function *local_118;
  vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *local_110;
  _Head_base<0UL,_spv::Instruction_*,_false> local_108;
  Id local_fc;
  Vector<Id> local_f8;
  Instruction *local_d8;
  Id local_d0;
  Id local_cc;
  Function *local_c8;
  Instruction *local_c0;
  Id local_b4;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b0;
  Instruction *local_a8;
  Block *local_a0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_98;
  Instruction *local_90;
  Block *local_88;
  Id local_7c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  *local_38;
  
  local_120 = SPIRVModule::get_builder(module);
  local_c8 = (Function *)module;
  pBVar9 = SPIRVModule::get_builder(module);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
  local_130._M_head_impl._0_4_ = spv::Builder::makeVectorType(pBVar9,IVar6,2);
  local_108._M_head_impl._0_4_ = spv::Builder::makeRuntimeArray(pBVar9,IVar6);
  spv::Builder::addDecoration(pBVar9,(Id)local_108._M_head_impl,DecorationArrayStride,4);
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
             (iterator)0x0,(uint *)&local_130);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish = IVar6;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_108);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish = (Id)local_108._M_head_impl;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  IVar6 = spv::Builder::makeStructType(pBVar9,&local_f8,"DescriptorHeapGlobalQAData");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,0,DecorationOffset,0);
  spv::Builder::addMemberName(pBVar9,IVar6,0,"failed_shader_hash");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,1,DecorationOffset,8);
  spv::Builder::addMemberName(pBVar9,IVar6,1,"failed_offset");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,2,DecorationOffset,0xc);
  spv::Builder::addMemberName(pBVar9,IVar6,2,"failed_heap");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,3,DecorationOffset,0x10);
  spv::Builder::addMemberName(pBVar9,IVar6,3,"failed_cookie");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,4,DecorationOffset,0x14);
  spv::Builder::addMemberName(pBVar9,IVar6,4,"fault_atomic");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,5,DecorationOffset,0x18);
  spv::Builder::addMemberName(pBVar9,IVar6,5,"failed_instruction");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,6,DecorationOffset,0x1c);
  spv::Builder::addMemberName(pBVar9,IVar6,6,"failed_descriptor_type_mask");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,7,DecorationOffset,0x20);
  spv::Builder::addMemberName(pBVar9,IVar6,7,"actual_descriptor_type_mask");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,8,DecorationOffset,0x24);
  spv::Builder::addMemberName(pBVar9,IVar6,8,"fault_type");
  spv::Builder::addMemberDecoration(pBVar9,IVar6,9,DecorationOffset,0x28);
  spv::Builder::addMemberName(pBVar9,IVar6,9,"live_status_table");
  spv::Builder::addDecoration(pBVar9,IVar6,DecorationBlock,-1);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  pFVar11 = local_c8;
  IVar6 = SPIRVModule::create_variable
                    ((SPIRVModule *)local_c8,StorageClassStorageBuffer,IVar6,"QAGlobalData");
  pDVar10 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)pFVar11);
  spv::Builder::addDecoration(pBVar9,IVar6,DecorationDescriptorSet,pDVar10->global_desc_set);
  pDVar10 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)pFVar11);
  local_c0 = (Instruction *)CONCAT44(local_c0._4_4_,IVar6);
  spv::Builder::addDecoration(pBVar9,IVar6,DecorationBinding,pDVar10->global_binding);
  local_a0 = pBVar9->buildPoint;
  lVar21 = 0;
  local_108._M_head_impl = (Instruction *)0x0;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x1c);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 7;
  do {
    *(Id *)((long)local_f8.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar21) = IVar6;
    lVar21 = lVar21 + 4;
  } while (lVar21 != 0x1c);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 7;
  IVar6 = spv::Builder::makeVoidType(pBVar9);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar11 = spv::Builder::makeFunctionEntry
                      (pBVar9,DecorationMax,IVar6,"descriptor_qa_report_fault",&local_f8,&local_148,
                       (Block **)&local_108);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_148);
  local_7c = (pFVar11->functionInstruction).resultId;
  ppIVar3 = (pFVar11->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  IVar6 = ppIVar3[1]->resultId;
  IVar20 = ppIVar3[2]->resultId;
  IVar8 = ppIVar3[3]->resultId;
  IVar7 = ppIVar3[4]->resultId;
  id = ppIVar3[5]->resultId;
  local_124 = ppIVar3[6]->resultId;
  local_d8 = (Instruction *)CONCAT44(local_d8._4_4_,(*ppIVar3)->resultId);
  local_118 = pFVar11;
  spv::Builder::addName(pBVar9,(*ppIVar3)->resultId,"fault_type");
  local_88 = (Block *)CONCAT44(local_88._4_4_,IVar6);
  spv::Builder::addName(pBVar9,IVar6,"heap_offset");
  local_d0 = IVar20;
  spv::Builder::addName(pBVar9,IVar20,"cookie");
  local_cc = IVar8;
  spv::Builder::addName(pBVar9,IVar8,"heap_index");
  local_fc = IVar7;
  spv::Builder::addName(pBVar9,IVar7,"descriptor_type");
  local_a8 = (Instruction *)CONCAT44(local_a8._4_4_,id);
  spv::Builder::addName(pBVar9,id,"actual_descriptor_type");
  spv::Builder::addName(pBVar9,local_124,"instruction");
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_110 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
              CONCAT44(local_110._4_4_,IVar6);
  IVar6 = spv::Builder::makePointer(pBVar9,StorageClassStorageBuffer,IVar6);
  IVar20 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar20;
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar20;
  pIVar12->typeId = IVar6;
  pIVar12->opCode = OpAccessChain;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (Id)local_c0;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar12->operands
             ,(iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,4,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar6;
  pIVar13 = (Instruction *)allocate_in_thread(0x38);
  pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar13->resultId = IVar6;
  pIVar13->typeId = (Id)local_110;
  pIVar13->opCode = OpAtomicIAdd;
  pVVar2 = &pIVar13->operands;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar13->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
             (iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,1,false);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,1,false);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar20 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar20;
  IVar6 = spv::Builder::makeBoolType(pBVar9);
  pIVar14 = (Instruction *)allocate_in_thread(0x38);
  pIVar14->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar14->resultId = IVar20;
  pIVar14->typeId = IVar6;
  pIVar14->opCode = OpIEqual;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar14->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar14->operands
             ,(iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
  iVar19._M_current =
       (pIVar14->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90 = pIVar12;
  if (iVar19._M_current ==
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar14->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = IVar6;
    (pIVar14->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  local_b4 = pIVar14->resultId;
  pBVar15 = (Block *)allocate_in_thread(0x78);
  IVar6 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar6;
  pBVar15->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
  (pBVar15->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar15->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar15->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar15->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar15->parent = local_118;
  pBVar15->unreachable = false;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
  *(undefined ***)
   &(local_148.
     super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
  *(Id *)(local_148.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_148);
  if (local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(local_148.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
  }
  pFVar11 = local_118;
  ((pBVar15->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar15;
  spv::Module::mapInstruction
            (local_118->parent,
             (pBVar15->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  pBVar16 = (Block *)allocate_in_thread(0x78);
  IVar6 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar6;
  pBVar16->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
  local_38 = (vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar16->instructions;
  (pBVar16->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar16->parent = pFVar11;
  pBVar16->unreachable = false;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
  *(undefined ***)
   &(local_148.
     super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
  *(Id *)(local_148.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            (local_38,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_148);
  if (local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(local_148.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
  }
  ((pBVar16->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar16;
  ppMVar1 = &local_118->parent;
  local_118 = (Function *)pBVar16;
  spv::Module::mapInstruction
            (*ppMVar1,(pBVar16->instructions).
                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  pIVar12 = local_90;
  _Var5._M_head_impl = local_108._M_head_impl;
  pBVar9->buildPoint = (Block *)local_108._M_head_impl;
  local_98._M_head_impl = local_90;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&(local_108._M_head_impl)->resultId,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_98);
  pIVar12->block = (Block *)_Var5._M_head_impl;
  if (pIVar12->resultId != 0) {
    spv::Module::mapInstruction(((Function *)_Var5._M_head_impl[1].block)->parent,pIVar12);
  }
  if (local_98._M_head_impl != (Instruction *)0x0) {
    (*(local_98._M_head_impl)->_vptr_Instruction[1])();
  }
  _Var5._M_head_impl = local_108._M_head_impl;
  local_98._M_head_impl = (Instruction *)0x0;
  local_b0._M_head_impl = pIVar13;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&(local_108._M_head_impl)->resultId,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b0);
  pFVar11 = local_118;
  pIVar13->block = (Block *)_Var5._M_head_impl;
  if (pIVar13->resultId != 0) {
    spv::Module::mapInstruction(((Function *)_Var5._M_head_impl[1].block)->parent,pIVar13);
  }
  if (local_b0._M_head_impl != (Instruction *)0x0) {
    (*(local_b0._M_head_impl)->_vptr_Instruction[1])();
  }
  _Var5._M_head_impl = local_108._M_head_impl;
  local_b0._M_head_impl = (Instruction *)0x0;
  local_40._M_head_impl = pIVar14;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&(local_108._M_head_impl)->resultId,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  this = local_120;
  pIVar14->block = (Block *)_Var5._M_head_impl;
  if (pIVar14->resultId != 0) {
    spv::Module::mapInstruction(((Function *)_Var5._M_head_impl[1].block)->parent,pIVar14);
  }
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  local_40._M_head_impl = (Instruction *)0x0;
  spv::Builder::createSelectionMerge(pBVar9,(Block *)pFVar11,0);
  spv::Builder::createConditionalBranch(pBVar9,local_b4,pBVar15,(Block *)pFVar11);
  pBVar9->buildPoint = pBVar15;
  IVar6 = (Id)local_110;
  IVar20 = (Id)local_c0;
  build_ssbo_store(pBVar9,(Id)local_110,(Id)local_c0,3,local_d0);
  build_ssbo_store(pBVar9,IVar6,IVar20,1,(Id)local_88);
  build_ssbo_store(pBVar9,IVar6,IVar20,2,local_cc);
  build_ssbo_store(pBVar9,IVar6,IVar20,6,local_fc);
  build_ssbo_store(pBVar9,IVar6,IVar20,7,(Id)local_a8);
  build_ssbo_store(pBVar9,IVar6,IVar20,5,local_124);
  local_124 = spv::Builder::makeVectorType(pBVar9,IVar6,2);
  pFVar11 = local_c8;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar10 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)local_c8);
  uVar4 = pDVar10->shader_hash;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,(uint)uVar4,false);
  local_130._M_head_impl._0_4_ = IVar6;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  _M_realloc_insert<unsigned_int>
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_148,
             (iterator)0x0,(uint *)&local_130);
  pDVar10 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)pFVar11);
  value = *(uint *)((long)&pDVar10->shader_hash + 4);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_130._M_head_impl._0_4_ = spv::Builder::makeIntConstant(pBVar9,IVar6,value,false);
  if (local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_148,
               (iterator)
               local_148.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_130);
  }
  else {
    *(Id *)local_148.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = (Id)local_130._M_head_impl;
    local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
  IVar6 = local_124;
  IVar20 = spv::Builder::makeCompositeConstant(pBVar9,local_124,(Vector<Id> *)&local_148,false);
  build_ssbo_store(pBVar9,IVar6,(Id)local_c0,0,IVar20);
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = 0;
  pIVar12->typeId = 0;
  pIVar12->opCode = OpMemoryBarrier;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_130._M_head_impl._0_4_ = spv::Builder::makeIntConstant(pBVar9,IVar6,1,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_130);
  }
  else {
    *iVar19._M_current = (Id)local_130._M_head_impl;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_130._M_head_impl._0_4_ = spv::Builder::makeIntConstant(pBVar9,IVar6,0x48,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_130);
  }
  else {
    *iVar19._M_current = (Id)local_130._M_head_impl;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pFVar11 = local_118;
  pBVar15 = pBVar9->buildPoint;
  local_130._M_head_impl = pIVar12;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_130);
  pIVar12->block = pBVar15;
  if (pIVar12->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar12);
  }
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  build_ssbo_store(pBVar9,(Id)local_110,(Id)local_c0,8,(Id)local_d8);
  spv::Builder::createBranch(pBVar9,(Block *)pFVar11);
  if (local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_148.
                   super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  pBVar9->buildPoint = (Block *)pFVar11;
  spv::Builder::makeReturn(pBVar9,false,0);
  pBVar9->buildPoint = local_a0;
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
  IVar6 = spv::Builder::makeVectorType(this,IVar6,2);
  IVar6 = spv::Builder::makeRuntimeArray(this,IVar6);
  local_130._M_head_impl._0_4_ = IVar6;
  spv::Builder::addDecoration(this,IVar6,DecorationArrayStride,8);
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
             (iterator)0x0,(uint *)&local_148);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_148);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_130);
  }
  else {
    *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_finish = IVar6;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  IVar6 = spv::Builder::makeStructType(this,&local_f8,"DescriptorHeapQAData");
  spv::Builder::addMemberDecoration(this,IVar6,0,DecorationOffset,0);
  spv::Builder::addMemberName(this,IVar6,0,"descriptor_count");
  spv::Builder::addMemberDecoration(this,IVar6,1,DecorationOffset,4);
  spv::Builder::addMemberName(this,IVar6,1,"heap_index");
  spv::Builder::addMemberDecoration(this,IVar6,2,DecorationOffset,8);
  spv::Builder::addMemberName(this,IVar6,2,"cookies_descriptor_info");
  spv::Builder::addDecoration(this,IVar6,DecorationBlock,-1);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  pFVar11 = local_c8;
  IVar7 = SPIRVModule::create_variable
                    ((SPIRVModule *)local_c8,StorageClassStorageBuffer,IVar6,"QAHeapData");
  pDVar10 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)pFVar11);
  spv::Builder::addDecoration(this,IVar7,DecorationDescriptorSet,pDVar10->heap_desc_set);
  pDVar10 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)pFVar11);
  spv::Builder::addDecoration(this,IVar7,DecorationBinding,pDVar10->heap_binding);
  spv::Builder::addDecoration(this,IVar7,DecorationNonWritable,-1);
  local_88 = this->buildPoint;
  local_b0._M_head_impl = (Instruction *)0x0;
  IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0xc);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 3;
  *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = IVar6;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = IVar6;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = IVar6;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar11 = spv::Builder::makeFunctionEntry
                      (this,DecorationMax,IVar6,"descriptor_qa_check",&local_f8,&local_148,
                       (Block **)&local_b0);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_148);
  this->buildPoint = (Block *)local_b0._M_head_impl;
  ppIVar3 = (pFVar11->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  IVar6 = (*ppIVar3)->resultId;
  IVar20 = ppIVar3[1]->resultId;
  IVar8 = ppIVar3[2]->resultId;
  local_c8 = pFVar11;
  spv::Builder::addName(this,IVar6,"heap_offset");
  local_a0 = (Block *)CONCAT44(local_a0._4_4_,IVar20);
  spv::Builder::addName(this,IVar20,"descriptor_type_mask");
  local_d0 = IVar8;
  spv::Builder::addName(this,IVar8,"instruction");
  IVar20 = spv::Builder::makeIntegerType(this,0x20,false);
  local_124 = build_ssbo_load(this,IVar20,IVar7,0);
  IVar20 = spv::Builder::makeIntegerType(this,0x20,false);
  local_fc = build_ssbo_load(this,IVar20,IVar7,1);
  IVar20 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar20 = spv::Builder::makeVectorType(this,IVar20,2);
  IVar20 = build_ssbo_load_array(this,IVar20,IVar7,2,IVar6);
  IVar8 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar7 = this->uniqueId + 1;
  this->uniqueId = IVar7;
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar7;
  local_110 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
              CONCAT44(local_110._4_4_,IVar8);
  pIVar12->typeId = IVar8;
  pIVar12->opCode = OpCompositeExtract;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar20;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar12->operands
             ,(iterator)0x0,(uint *)&local_148);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = 0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar8 = this->uniqueId + 1;
  this->uniqueId = IVar8;
  pIVar13 = (Instruction *)allocate_in_thread(0x38);
  pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar13->resultId = IVar8;
  pIVar13->typeId = (Id)local_110;
  pIVar13->opCode = OpCompositeExtract;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar13->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar20;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar13->operands
             ,(iterator)0x0,(uint *)&local_148);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  local_118 = (Function *)CONCAT44(local_118._4_4_,IVar6);
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar13->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = 1;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pBVar9 = local_120;
  IVar6 = local_120->uniqueId + 1;
  local_120->uniqueId = IVar6;
  pIVar14 = (Instruction *)allocate_in_thread(0x38);
  pIVar14->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar14->resultId = IVar6;
  pIVar14->typeId = (Id)local_110;
  pIVar14->opCode = OpShiftRightLogical;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar14->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar14->operands
             ,(iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,5,false);
  iVar19._M_current =
       (pIVar14->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar14->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar14->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pBVar9 = local_120;
  IVar6 = local_120->uniqueId + 1;
  local_120->uniqueId = IVar6;
  pIVar17 = (Instruction *)allocate_in_thread(0x38);
  pIVar17->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar17->resultId = IVar6;
  pIVar17->typeId = (Id)local_110;
  pIVar17->opCode = OpBitwiseAnd;
  local_110 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
              &pIVar17->operands;
  (pIVar17->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar17->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar17->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar17->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>(local_110,(iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,0x1f,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
  iVar19._M_current =
       (pIVar17->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar17->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>(local_110,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = IVar6;
    (pIVar17->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  local_cc = pIVar12->resultId;
  local_110 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
              CONCAT44(local_110._4_4_,pIVar13->resultId);
  IVar6 = pIVar14->resultId;
  local_d8 = (Instruction *)CONCAT44(local_d8._4_4_,pIVar17->resultId);
  pBVar15 = local_120->buildPoint;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar12;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_148);
  pIVar12->block = pBVar15;
  if (pIVar12->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar12);
  }
  if ((Instruction *)
      local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
    (*(*(_func_int ***)
        &(local_148.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
  }
  pBVar9 = local_120;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pBVar15 = local_120->buildPoint;
  local_130._M_head_impl = pIVar14;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_130);
  pIVar14->block = pBVar15;
  if (pIVar14->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar14);
  }
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  local_130._M_head_impl = (Instruction *)0x0;
  pBVar15 = pBVar9->buildPoint;
  local_108._M_head_impl = pIVar17;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_108);
  pIVar17->block = pBVar15;
  if (pIVar17->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar17);
  }
  if (local_108._M_head_impl != (Instruction *)0x0) {
    (*(local_108._M_head_impl)->_vptr_Instruction[1])();
  }
  local_108._M_head_impl = (Instruction *)0x0;
  pBVar15 = pBVar9->buildPoint;
  local_98._M_head_impl = pIVar13;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_98);
  pIVar13->block = pBVar15;
  if (pIVar13->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar13);
  }
  if (local_98._M_head_impl != (Instruction *)0x0) {
    (*(local_98._M_head_impl)->_vptr_Instruction[1])();
  }
  IVar20 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar6 = build_ssbo_load_array(pBVar9,IVar20,(Id)local_c0,9,IVar6);
  IVar20 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar8 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar8;
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar8;
  pIVar12->typeId = IVar20;
  pIVar12->opCode = OpShiftLeftLogical;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  IVar8 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar8 = spv::Builder::makeIntConstant(pBVar9,IVar8,1,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar18 = (pIVar12->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar19._M_current == puVar18) {
    local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar8;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = IVar8;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (Id)local_d8;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = (Id)local_d8;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar8 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar8;
  pIVar13 = (Instruction *)allocate_in_thread(0x38);
  pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar13->resultId = IVar8;
  pIVar13->typeId = IVar20;
  pIVar13->opCode = OpBitwiseAnd;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar13->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar6;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar13->operands
             ,(iterator)0x0,(uint *)&local_148);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar13->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar20 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar20;
  IVar6 = spv::Builder::makeBoolType(pBVar9);
  pIVar14 = (Instruction *)allocate_in_thread(0x38);
  pIVar14->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar14->resultId = IVar20;
  pIVar14->typeId = IVar6;
  pIVar14->opCode = OpINotEqual;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar14->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar14->operands
             ,(iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
  iVar19._M_current =
       (pIVar14->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar14->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = IVar6;
    (pIVar14->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = (Id)local_118;
  local_d8 = (Instruction *)CONCAT44(local_d8._4_4_,pIVar14->resultId);
  pBVar15 = local_120->buildPoint;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar12;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_148);
  pIVar12->block = pBVar15;
  if (pIVar12->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar12);
  }
  if ((Instruction *)
      local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
    (*(*(_func_int ***)
        &(local_148.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
  }
  pBVar9 = local_120;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pBVar15 = local_120->buildPoint;
  local_130._M_head_impl = pIVar13;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_130);
  pIVar13->block = pBVar15;
  if (pIVar13->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar13);
  }
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  local_130._M_head_impl = (Instruction *)0x0;
  pBVar15 = pBVar9->buildPoint;
  local_108._M_head_impl = pIVar14;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_108);
  pIVar14->block = pBVar15;
  IVar20 = (Id)local_a0;
  if (pIVar14->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar14);
  }
  if (local_108._M_head_impl != (Instruction *)0x0) {
    (*(local_108._M_head_impl)->_vptr_Instruction[1])();
  }
  IVar8 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar8 = build_binary_op(pBVar9,IVar8,OpBitwiseAnd,(Id)local_110,IVar20);
  IVar7 = spv::Builder::makeBoolType(pBVar9);
  IVar20 = build_binary_op(pBVar9,IVar7,OpIEqual,IVar8,IVar20);
  IVar8 = spv::Builder::makeBoolType(pBVar9);
  IVar6 = build_binary_op(pBVar9,IVar8,OpUGreaterThanEqual,IVar6,local_124);
  IVar7 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar7;
  IVar8 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar7;
  pIVar12->typeId = IVar8;
  pIVar12->opCode = OpSelect;
  pVVar2 = &pIVar12->operands;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar6;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
             (iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,1,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c0 = pIVar12;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar8 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar8;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar8;
  pIVar12->typeId = IVar6;
  pIVar12->opCode = OpSelect;
  pVVar2 = &pIVar12->operands;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar20;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
             (iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,2,false);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  IVar20 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar20;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  pIVar13 = (Instruction *)allocate_in_thread(0x38);
  pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar13->resultId = IVar20;
  pIVar13->typeId = IVar6;
  pIVar13->opCode = OpSelect;
  pVVar2 = &pIVar13->operands;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar13->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (Id)local_d8;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
             (iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pBVar9 = local_120;
  IVar6 = spv::Builder::makeIntegerType(local_120,0x20,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar9,IVar6,4,false);
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8 = pIVar12;
  local_a8 = pIVar13;
  if (iVar19._M_current ==
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pBVar9 = local_120;
  IVar20 = local_120->uniqueId + 1;
  local_120->uniqueId = IVar20;
  IVar6 = spv::Builder::makeIntegerType(local_120,0x20,false);
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar20;
  pIVar12->typeId = IVar6;
  pIVar12->opCode = OpBitwiseOr;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  IVar20 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar20;
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  pIVar13 = (Instruction *)allocate_in_thread(0x38);
  pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar13->resultId = IVar20;
  pIVar13->typeId = IVar6;
  pIVar13->opCode = OpBitwiseOr;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar13->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar13->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_c0->resultId;
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar18 = (pIVar12->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  pIVar14 = local_a8;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_d8->resultId;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
  iVar19._M_current =
       (pIVar13->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar18 = (pIVar13->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar13->operands,iVar19,(uint *)&local_148);
    iVar19._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar13->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar14->resultId;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar13->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current =
         (Id)local_148.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pBVar9 = local_120;
  IVar20 = local_120->uniqueId + 1;
  local_120->uniqueId = IVar20;
  IVar6 = spv::Builder::makeBoolType(local_120);
  pIVar14 = (Instruction *)allocate_in_thread(0x38);
  pIVar14->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar14->resultId = IVar20;
  pIVar14->typeId = IVar6;
  pIVar14->opCode = OpINotEqual;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar14->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar14->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar14->operands
             ,(iterator)0x0,(uint *)&local_148);
  IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
  IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
  iVar19._M_current =
       (pIVar14->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar19._M_current ==
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar14->operands,iVar19,(uint *)&local_148);
  }
  else {
    *iVar19._M_current = IVar6;
    (pIVar14->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pIVar17 = local_c0;
  local_90 = (Instruction *)CONCAT44(local_90._4_4_,pIVar13->resultId);
  local_b4 = pIVar14->resultId;
  pBVar15 = local_120->buildPoint;
  local_48._M_head_impl = local_c0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  instruction = local_a8;
  pIVar17->block = pBVar15;
  if (pIVar17->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar17);
  }
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  pIVar17 = local_d8;
  local_48._M_head_impl = (Instruction *)0x0;
  pBVar15 = local_120->buildPoint;
  local_50._M_head_impl = local_d8;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  pIVar17->block = pBVar15;
  if (pIVar17->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar17);
  }
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  local_50._M_head_impl = (Instruction *)0x0;
  pBVar15 = local_120->buildPoint;
  local_58._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58);
  instruction->block = pBVar15;
  if (instruction->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,instruction);
  }
  if (local_58._M_head_impl != (Instruction *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Instruction[1])();
  }
  pBVar9 = local_120;
  local_58._M_head_impl = (Instruction *)0x0;
  pBVar15 = local_120->buildPoint;
  local_60._M_head_impl = pIVar12;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_60);
  pIVar12->block = pBVar15;
  if (pIVar12->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar12);
  }
  if (local_60._M_head_impl != (Instruction *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Instruction[1])();
  }
  local_60._M_head_impl = (Instruction *)0x0;
  pBVar15 = pBVar9->buildPoint;
  local_68._M_head_impl = pIVar13;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
  pIVar13->block = pBVar15;
  if (pIVar13->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar13);
  }
  if (local_68._M_head_impl != (Instruction *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Instruction[1])();
  }
  local_68._M_head_impl = (Instruction *)0x0;
  pBVar15 = pBVar9->buildPoint;
  local_70._M_head_impl = pIVar14;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_70);
  pIVar14->block = pBVar15;
  if (pIVar14->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar14);
  }
  if (local_70._M_head_impl != (Instruction *)0x0) {
    (*(local_70._M_head_impl)->_vptr_Instruction[1])();
  }
  local_70._M_head_impl = (Instruction *)0x0;
  pBVar15 = (Block *)allocate_in_thread(0x78);
  IVar6 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar6;
  pBVar15->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
  (pBVar15->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar15->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar15->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar15->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar15->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar15->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar15->parent = local_c8;
  pBVar15->unreachable = false;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
  *(undefined ***)
   &(local_148.
     super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
  *(Id *)(local_148.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_148);
  if (local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(local_148.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
  }
  pFVar11 = local_c8;
  ((pBVar15->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar15;
  spv::Module::mapInstruction
            (local_c8->parent,
             (pBVar15->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  pBVar16 = (Block *)allocate_in_thread(0x78);
  IVar6 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar6;
  pBVar16->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
  (pBVar16->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar16->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar16->parent = pFVar11;
  pBVar16->unreachable = false;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
  *(undefined ***)
   &(local_148.
     super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
  *(Id *)(local_148.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
  *(undefined8 *)
   (local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar16->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_148);
  if (local_148.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(local_148.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
  }
  ((pBVar16->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar16;
  spv::Module::mapInstruction
            (local_c8->parent,
             (pBVar16->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  spv::Builder::createSelectionMerge(pBVar9,pBVar16,0);
  spv::Builder::createConditionalBranch(pBVar9,local_b4,pBVar15,pBVar16);
  pBVar9->buildPoint = pBVar15;
  IVar20 = pBVar9->uniqueId + 1;
  pBVar9->uniqueId = IVar20;
  IVar6 = spv::Builder::makeVoidType(pBVar9);
  pIVar12 = (Instruction *)allocate_in_thread(0x38);
  pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar12->resultId = IVar20;
  pIVar12->typeId = IVar6;
  pIVar12->opCode = OpFunctionCall;
  pVVar2 = &pIVar12->operands;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar12->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar12->block = (Block *)0x0;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_7c;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
             (iterator)0x0,(uint *)&local_148);
  iVar19._M_current =
       (pIVar12->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar18 = (pIVar12->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)local_90;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = (uint)local_90;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  IVar20 = local_d0;
  IVar6 = (Id)local_118;
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (Id)local_118;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = (Id)local_118;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_cc;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = local_cc;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  if (iVar19._M_current == puVar18) {
    local_148.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_fc;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = local_fc;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (Id)local_a0;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = (Id)local_a0;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (Id)local_110;
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
    iVar19._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar18 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar19._M_current = (Id)local_110;
    iVar19._M_current = iVar19._M_current + 1;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current;
  }
  local_148.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar20);
  if (iVar19._M_current == puVar18) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar19,
               (uint *)&local_148);
  }
  else {
    *iVar19._M_current = IVar20;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar19._M_current + 1;
  }
  pBVar15 = pBVar9->buildPoint;
  local_78._M_head_impl = pIVar12;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar15->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_78);
  pIVar12->block = pBVar15;
  if (pIVar12->resultId != 0) {
    spv::Module::mapInstruction(pBVar15->parent->parent,pIVar12);
  }
  if (local_78._M_head_impl != (Instruction *)0x0) {
    (*(local_78._M_head_impl)->_vptr_Instruction[1])();
  }
  local_78._M_head_impl = (Instruction *)0x0;
  spv::Builder::makeReturn(pBVar9,false,local_124);
  pBVar9->buildPoint = pBVar16;
  spv::Builder::makeReturn(pBVar9,false,IVar6);
  pBVar9->buildPoint = local_88;
  IVar6 = (local_c8->functionInstruction).resultId;
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar6;
}

Assistant:

spv::Id build_descriptor_qa_check_function(SPIRVModule &module)
{
	auto &builder = module.get_builder();
	spv::Id fault_func_id, global_buffer_id;
	build_descriptor_qa_fault_report(module, fault_func_id, global_buffer_id);

	spv::Id heap_buffer_type_id = build_descriptor_qa_heap_buffer_type(builder);
	spv::Id descriptor_qa_heap_buffer_id = module.create_variable(spv::StorageClassStorageBuffer,
	                                                              heap_buffer_type_id, "QAHeapData");
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationDescriptorSet,
	                      module.get_descriptor_qa_info().heap_desc_set);
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationBinding,
	                      module.get_descriptor_qa_info().heap_binding);
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationNonWritable);

	auto heap_buffer_id = descriptor_qa_heap_buffer_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;

	Vector<spv::Id> param_types(3, builder.makeUintType(32));
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeUintType(32),
	                                       "descriptor_qa_check",
	                                       param_types, {}, &entry);
	builder.setBuildPoint(entry);

	spv::Id offset_id = func->getParamId(0);
	spv::Id descriptor_type_id = func->getParamId(1);
	spv::Id instruction_id = func->getParamId(2);

	builder.addName(offset_id, "heap_offset");
	builder.addName(descriptor_type_id, "descriptor_type_mask");
	builder.addName(instruction_id, "instruction");

	spv::Id descriptor_count_id = build_ssbo_load(builder, builder.makeUintType(32), heap_buffer_id,
	                                              uint32_t(DescriptorQAHeapMembers::DescriptorCount));

	spv::Id fallback_offset_id = descriptor_count_id;

	spv::Id heap_id = build_ssbo_load(builder, builder.makeUintType(32), heap_buffer_id,
	                                  uint32_t(DescriptorQAHeapMembers::HeapIndex));
	spv::Id cookie_descriptor_info = build_ssbo_load_array(builder, builder.makeVectorType(builder.makeUintType(32), 2),
	                                                       heap_buffer_id,
	                                                       uint32_t(DescriptorQAHeapMembers::CookiesDescriptorInfo),
	                                                       offset_id);
	spv::Id cookie_id;
	spv::Id cookie_shifted_id;
	spv::Id cookie_mask_id;
	spv::Id descriptor_info_id;
	build_cookie_descriptor_info_split(builder, cookie_descriptor_info, cookie_id,
	                                   cookie_shifted_id, cookie_mask_id, descriptor_info_id);

	spv::Id live_status_id = build_ssbo_load_array(builder, builder.makeUintType(32),
	                                               global_buffer_id,
	                                               uint32_t(DescriptorQAGlobalMembers::LiveStatusTable),
	                                               cookie_shifted_id);
	spv::Id live_status_cond_id = build_live_check(builder, live_status_id, cookie_mask_id);

	spv::Id type_cond_id = build_binary_op(builder, builder.makeUintType(32), spv::OpBitwiseAnd, descriptor_info_id, descriptor_type_id);
	type_cond_id = build_binary_op(builder, builder.makeBoolType(), spv::OpIEqual,
	                               type_cond_id, descriptor_type_id);

	spv::Id out_of_range_id = build_binary_op(builder, builder.makeBoolType(), spv::OpUGreaterThanEqual,
	                                          offset_id, descriptor_count_id);

	// First check: descriptor index is in range of heap.
	auto range_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	range_check->addIdOperand(out_of_range_id);
	range_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_INDEX_OUT_OF_RANGE_BIT));
	range_check->addIdOperand(builder.makeUintConstant(0u));

	// Second: Check if type matches.
	auto type_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	type_check->addIdOperand(type_cond_id);
	type_check->addIdOperand(builder.makeUintConstant(0u));
	type_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_INVALID_TYPE_BIT));

	// Third: Check if cookie is alive.
	auto alive_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	alive_check->addIdOperand(live_status_cond_id);
	alive_check->addIdOperand(builder.makeUintConstant(0u));
	alive_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_RESOURCE_DESTROYED_BIT));

	auto merge_check0 = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpBitwiseOr);
	auto merge_check1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpBitwiseOr);
	merge_check0->addIdOperand(range_check->getResultId());
	merge_check0->addIdOperand(type_check->getResultId());
	merge_check1->addIdOperand(merge_check0->getResultId());
	merge_check1->addIdOperand(alive_check->getResultId());

	auto fault_cond = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeBoolType(), spv::OpINotEqual);
	fault_cond->addIdOperand(merge_check1->getResultId());
	fault_cond->addIdOperand(builder.makeUintConstant(0u));

	spv::Id fault_type_id = merge_check1->getResultId();
	spv::Id fault_cond_id = fault_cond->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(range_check));
	builder.getBuildPoint()->addInstruction(std::move(type_check));
	builder.getBuildPoint()->addInstruction(std::move(alive_check));
	builder.getBuildPoint()->addInstruction(std::move(merge_check0));
	builder.getBuildPoint()->addInstruction(std::move(merge_check1));
	builder.getBuildPoint()->addInstruction(std::move(fault_cond));

	auto *fault_block = new spv::Block(builder.getUniqueId(), *func);
	auto *correct_block = new spv::Block(builder.getUniqueId(), *func);
	builder.createSelectionMerge(correct_block, 0);
	builder.createConditionalBranch(fault_cond_id, fault_block, correct_block);
	{
		builder.setBuildPoint(fault_block);
		auto call = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeVoidType(), spv::OpFunctionCall);
		call->addIdOperand(fault_func_id);
		call->addIdOperand(fault_type_id);
		call->addIdOperand(offset_id);
		call->addIdOperand(cookie_id);
		call->addIdOperand(heap_id);
		call->addIdOperand(descriptor_type_id);
		call->addIdOperand(descriptor_info_id);
		call->addIdOperand(instruction_id);
		builder.getBuildPoint()->addInstruction(std::move(call));
		builder.makeReturn(false, fallback_offset_id);
	}
	builder.setBuildPoint(correct_block);
	builder.makeReturn(false, offset_id);

	builder.setBuildPoint(current_build_point);
	return func->getId();
}